

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O2

void __thiscall KVStore::compaction(KVStore *this,int level)

{
  string *__lhs;
  pointer ppVar1;
  pointer ppVar2;
  pointer pbVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  mapped_type *ppSVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *this_00;
  reference pvVar9;
  SSTableCache *pSVar10;
  size_type sVar11;
  string *name;
  pointer pbVar12;
  pointer pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  int iVar14;
  long lVar15;
  size_type __n;
  __mode_t __mode;
  string *psVar16;
  _Iter_comp_val<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_markcty[P]LSM_KV_kvstore_cpp:130:16)>
  *in_R8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
  *this_01;
  size_type sVar17;
  unsigned_long uVar18;
  uint64_t i;
  long lVar19;
  ulong uVar20;
  int n;
  undefined8 uVar21;
  size_type sVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  undefined8 uVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  pointer local_308;
  pointer local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compactionFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  SSTableDic t;
  SSTableDic mergedDic;
  string nextDir;
  vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  dics;
  value_type top;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  string local_150;
  string dir;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  __lhs = &this->storagePath;
  std::operator+(&nextDir,__lhs,"/level-");
  std::__cxx11::to_string(&fileName,level);
  std::operator+(&dir,&nextDir,&fileName);
  std::__cxx11::string::~string((string *)&fileName);
  std::__cxx11::string::~string((string *)&nextDir);
  std::__cxx11::string::string((string *)&local_50,(string *)&dir);
  bVar5 = utils::dirExists(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar5) {
    dirFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dirFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dirFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    n = level + 1;
    iVar6 = pow2(n);
    std::__cxx11::string::string((string *)&local_d0,(string *)&dir);
    iVar7 = utils::scanDir(&local_d0,&dirFiles);
    std::__cxx11::string::~string((string *)&local_d0);
    pbVar13 = dirFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar14 = iVar6 - iVar7;
    if (iVar6 < iVar7) {
      for (pbVar12 = dirFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
          pbVar12 = pbVar12 + 1) {
        std::operator+(&nextDir,&dir,'/');
        std::__cxx11::string::insert((ulong)pbVar12,(string *)0x0);
        std::__cxx11::string::~string((string *)&nextDir);
      }
      compactionFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      compactionFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      compactionFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (level == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&compactionFiles,&dirFiles);
      }
      else {
        local_2a8._M_dataplus._M_p = (pointer)0x0;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_allocated_capacity = 0;
        nextDir._M_dataplus._M_p = (pointer)0x0;
        nextDir._M_string_length = 0;
        nextDir.field_2._M_allocated_capacity = 0;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
                   *)&nextDir);
        pbVar13 = dirFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = dirFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
            pbVar12 = pbVar12 + 1) {
          ppSVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                    ::at(&this->cache,pbVar12);
          SSTableCache::getHeader(*ppSVar8);
          std::
          vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>
          ::emplace_back<std::__cxx11::string_const&,SSTableHeader>
                    ((vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>
                      *)&local_2a8,pbVar12,(SSTableHeader *)&top);
          sVar22 = local_2a8._M_string_length;
          _Var4._M_p = local_2a8._M_dataplus._M_p;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)&nextDir,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)(local_2a8._M_string_length + -0x40));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)&fileName,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                  *)&nextDir);
          std::
          __push_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,SSTableHeader>*,std::vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>>,long,std::pair<std::__cxx11::string,SSTableHeader>,__gnu_cxx::__ops::_Iter_comp_val<KVStore::compaction(int)::__0>>
                    ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>_>
                      )_Var4._M_p,((long)(sVar22 - (long)_Var4._M_p) >> 6) + -1,0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                      *)&fileName,in_R8);
          std::__cxx11::string::~string((string *)&fileName);
          std::__cxx11::string::~string((string *)&nextDir);
        }
        for (; iVar14 != 0; iVar14 = iVar14 + 1) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
          ::pair(&top,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                       *)local_2a8._M_dataplus._M_p);
          _Var4._M_p = local_2a8._M_dataplus._M_p;
          if (0x40 < (long)(local_2a8._M_string_length - (long)local_2a8._M_dataplus._M_p)) {
            this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                       *)(local_2a8._M_string_length + -0x40);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)&nextDir,this_01);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::operator=(this_01,(type)_Var4._M_p);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)&fileName,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                    *)&nextDir);
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,SSTableHeader>*,std::vector<std::pair<std::__cxx11::string,SSTableHeader>,std::allocator<std::pair<std::__cxx11::string,SSTableHeader>>>>,long,std::pair<std::__cxx11::string,SSTableHeader>,__gnu_cxx::__ops::_Iter_comp_iter<KVStore::compaction(int)::__0>>
                      (_Var4._M_p,0,(long)this_01 - (long)_Var4._M_p >> 6,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>
                        *)&fileName);
            std::__cxx11::string::~string((string *)&fileName);
            std::__cxx11::string::~string((string *)&nextDir);
          }
          local_2a8._M_string_length = local_2a8._M_string_length + -0x40;
          std::__cxx11::string::~string((string *)local_2a8._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&compactionFiles,&top.first);
          std::__cxx11::string::~string((string *)&top);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableHeader>_>_>
                   *)&local_2a8);
      }
      pbVar13 = compactionFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = &this->cache;
      uVar23 = 0xffffffffffffffff;
      local_308 = (pointer)0x0;
      uVar21 = 0;
      for (pbVar12 = compactionFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
          pbVar12 = pbVar12 + 1) {
        ppSVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                  ::at(this_00,pbVar12);
        SSTableCache::getHeader(*ppSVar8);
        if ((ulong)uVar21 < (ulong)nextDir.field_2._8_8_) {
          uVar21 = nextDir.field_2._8_8_;
        }
        if (nextDir.field_2._M_allocated_capacity <= (ulong)uVar23) {
          uVar23 = nextDir.field_2._M_allocated_capacity;
        }
        if (local_308 < nextDir._M_dataplus._M_p) {
          local_308 = nextDir._M_dataplus._M_p;
        }
      }
      std::operator+(&fileName,__lhs,"/level-");
      std::__cxx11::to_string(&top.first,n);
      std::operator+(&nextDir,&fileName,&top.first);
      std::__cxx11::string::~string((string *)&top);
      std::__cxx11::string::~string((string *)&fileName);
      psVar16 = &nextDir;
      std::__cxx11::string::string((string *)&local_70,(string *)psVar16);
      __mode = (__mode_t)psVar16;
      bVar5 = utils::dirExists(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar5) {
        utils::mkdir(nextDir._M_dataplus._M_p,__mode);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&dirFiles);
      std::__cxx11::string::string((string *)&local_f0,(string *)&nextDir);
      utils::scanDir(&local_f0,&dirFiles);
      std::__cxx11::string::~string((string *)&local_f0);
      pbVar13 = dirFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = dirFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = dirFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pbVar12 != pbVar13;
          pbVar12 = pbVar12 + 1) {
        std::operator+(&fileName,&nextDir,'/');
        std::__cxx11::string::insert((ulong)pbVar12,(string *)0x0);
        std::__cxx11::string::~string((string *)&fileName);
      }
      for (pbVar13 = dirFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
          pbVar13 = pbVar13 + 1) {
        ppSVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                  ::at(this_00,pbVar13);
        SSTableCache::getHeader(*ppSVar8);
        if (((fileName.field_2._M_allocated_capacity <= (ulong)uVar21 &&
              (ulong)uVar23 <= fileName.field_2._M_allocated_capacity) ||
            ((ulong)fileName.field_2._8_8_ <= (ulong)uVar21 &&
             (ulong)uVar23 <= (ulong)fileName.field_2._8_8_)) &&
           (std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&compactionFiles,pbVar13), local_308 <= fileName._M_dataplus._M_p)) {
          local_308 = fileName._M_dataplus._M_p;
        }
      }
      lVar15 = (long)compactionFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)compactionFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      std::operator+(&fileName,__lhs,"/level-");
      std::__cxx11::to_string(&top.first,level + 2);
      std::operator+(&local_90,&fileName,&top.first);
      bVar5 = utils::dirExists(&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&top);
      std::__cxx11::string::~string((string *)&fileName);
      std::
      vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::vector(&dics,(long)compactionFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)compactionFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5,
               (allocator_type *)&fileName);
      __n = lVar15 >> 5;
      lVar15 = 0;
      lVar24 = 0;
      lVar19 = 0;
      sVar17 = __n;
      while (bVar26 = sVar17 != 0, sVar17 = sVar17 - 1, bVar26) {
        SSTable::readDic((string *)
                         ((long)&((compactionFiles.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar15),(SSTableDic *)
                                 ((long)&((dics.
                                           super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar24));
        unlink(*(char **)((long)&((compactionFiles.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar15));
        lVar19 = lVar19 + (*(long *)((long)&((dics.
                                              super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish + lVar24) -
                          *(long *)((long)&((dics.
                                             super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar24)) /
                          0x28;
        lVar24 = lVar24 + 0x18;
        lVar15 = lVar15 + 0x20;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&indices,__n,(allocator_type *)&fileName);
      mergedDic.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mergedDic.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mergedDic.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_300 = (pointer)0x0;
LAB_00104626:
      ppVar1 = mergedDic.
               super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar26 = lVar19 != 0;
      lVar19 = lVar19 + -1;
      if (bVar26) {
        lVar15 = 0;
        uVar18 = 0xffffffffffffffff;
        uVar25 = 0;
        for (uVar20 = 0; __n != uVar20; uVar20 = uVar20 + 1) {
          if ((indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20] <
               (ulong)((*(long *)((long)&((dics.
                                           super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + lVar15) -
                       *(long *)((long)&((dics.
                                          super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar15)) / 0x28
                      )) &&
             (pvVar9 = std::
                       vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&((dics.
                                         super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar15),
                            indices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar20]),
             pvVar9->first < uVar18)) {
            pvVar9 = std::
                     vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&((dics.
                                       super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar15),
                          indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar20]);
            uVar18 = pvVar9->first;
            uVar25 = uVar20 & 0xffffffff;
          }
          lVar15 = lVar15 + 0x18;
        }
        iVar6 = (int)uVar25;
        sVar17 = indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar6];
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = sVar17 + 1;
        pvVar9 = std::
                 vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(dics.
                      super__Vector_base<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar6,sVar17);
        ppSVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                  ::at(this_00,compactionFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar6);
        SSTableCache::getHeader(*ppSVar8);
        if ((mergedDic.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             mergedDic.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pvVar9->first ==
            mergedDic.
            super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].first)) goto code_r0x00104712;
        goto LAB_00104736;
      }
      t.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      t.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      t.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar19 = 0;
      lVar15 = 0;
      ppVar2 = mergedDic.
               super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (__lhs_00 = &ppVar2->second, (value_type *)((long)(__lhs_00 + -1) + 0x18) != ppVar1) {
        if ((bVar5) || (bVar26 = std::operator==(__lhs_00,"~DELETED~"), !bVar26)) {
          sVar22 = __lhs_00->_M_string_length;
          if (0x1fffff < lVar15 * 0xc + lVar19 + sVar22 + 0x2838) {
            std::operator+(&local_2a8,&nextDir,"/");
            iVar6 = this->fileNums;
            this->fileNums = iVar6 + 1;
            std::__cxx11::to_string(&local_150,iVar6);
            std::operator+(&top.first,&local_2a8,&local_150);
            std::operator+(&fileName,&top.first,".sst");
            std::__cxx11::string::~string((string *)&top);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_2a8);
            SSTable::toSSTable(&t,&fileName,(uint64_t)local_308);
            pSVar10 = (SSTableCache *)operator_new(0x2858);
            std::__cxx11::string::string((string *)&local_b0,(string *)&fileName);
            SSTableCache::SSTableCache(pSVar10,&t,(uint64_t)local_308,&local_b0);
            top.first._M_dataplus._M_p = (pointer)pSVar10;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
            ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                        *)this_00,&fileName,(SSTableCache **)&top);
            std::__cxx11::string::~string((string *)&local_b0);
            std::
            vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::clear(&t);
            std::__cxx11::string::~string((string *)&fileName);
            sVar22 = __lhs_00->_M_string_length;
            lVar19 = 0;
            lVar15 = 0;
          }
          std::
          vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(&t,(value_type *)((long)(__lhs_00 + -1) + 0x18));
          lVar19 = lVar19 + sVar22;
          lVar15 = lVar15 + 1;
        }
        ppVar2 = (pointer)(__lhs_00 + 1);
      }
      lVar15 = 0;
      while (bVar5 = __n != 0, __n = __n - 1, bVar5) {
        sVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                 ::count(this_00,(key_type *)
                                 ((long)&((compactionFiles.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar15));
        if (sVar11 == 0) {
          __assert_fail("cache.count(compactionFiles[i])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/kvstore.cpp"
                        ,0xf4,"void KVStore::compaction(int)");
        }
        ppSVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
                  ::at(this_00,(key_type *)
                               ((long)&((compactionFiles.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar15));
        pSVar10 = *ppSVar8;
        if (pSVar10 != (SSTableCache *)0x0) {
          SSTableCache::~SSTableCache(pSVar10);
        }
        operator_delete(pSVar10,0x2858);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
        ::erase(&this_00->_M_t,
                (key_type *)
                ((long)&((compactionFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar15));
        lVar15 = lVar15 + 0x20;
      }
      if (t.
          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          t.
          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_2a8,&nextDir,"/");
        iVar6 = this->fileNums;
        this->fileNums = iVar6 + 1;
        std::__cxx11::to_string(&local_150,iVar6);
        std::operator+(&top.first,&local_2a8,&local_150);
        std::operator+(&fileName,&top.first,".sst");
        std::__cxx11::string::~string((string *)&top);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_2a8);
        SSTable::toSSTable(&t,&fileName,(uint64_t)local_308);
        pSVar10 = (SSTableCache *)operator_new(0x2858);
        std::__cxx11::string::string((string *)&local_110,(string *)&fileName);
        SSTableCache::SSTableCache(pSVar10,&t,(uint64_t)local_308,&local_110);
        top.first._M_dataplus._M_p = (pointer)pSVar10;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
        ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                    *)this_00,&fileName,(SSTableCache **)&top);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&fileName);
      }
      compaction(this,n);
      std::
      vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&t);
      std::
      vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&mergedDic);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~vector(&dics);
      std::__cxx11::string::~string((string *)&nextDir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&compactionFiles);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dirFiles);
  }
  std::__cxx11::string::~string((string *)&dir);
  return;
code_r0x00104712:
  if (local_300 <= fileName._M_dataplus._M_p) {
    ppVar1 = mergedDic.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    mergedDic.
    super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         mergedDic.
         super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string((string *)&ppVar1->second);
LAB_00104736:
    std::
    vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
    ::emplace_back<unsigned_long_const&,std::__cxx11::string_const&>
              ((vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
                *)&mergedDic,&pvVar9->first,&pvVar9->second);
    local_300 = fileName._M_dataplus._M_p;
  }
  goto LAB_00104626;
}

Assistant:

void KVStore::compaction(int level) {
  string dir = storagePath + "/level-" + to_string(level);

  if (!utils::dirExists(dir)) return;

  vector<string> dirFiles;
  int maxFileNum = pow2(level + 1), fileNum = utils::scanDir(dir, dirFiles);
  if (fileNum <= maxFileNum) return;

  for (string &name : dirFiles) name.insert(0, dir + '/');

  // get the files which need compaction
  vector<string> compactionFiles;
  if (level == 0) {
    compactionFiles = dirFiles;
  } else {
    // find the files with smallest timeStamp
    using nameHeader = pair<string, SSTableHeader>;
    auto cmp = [](const nameHeader &left, const nameHeader &right) {
      const auto &lHeader = left.second;
      const auto &rHeader = right.second;
      return (lHeader.timeStamp > rHeader.timeStamp ||
              (lHeader.timeStamp == rHeader.timeStamp &&
               lHeader.minKey > rHeader.minKey));
    };
    priority_queue<nameHeader, vector<nameHeader>, decltype(cmp)> q(cmp);
    int k = fileNum - maxFileNum;
    for (const auto &file : dirFiles)
      q.emplace(file, cache.at(file)->getHeader());
    while (k--) {
      auto top = q.top();
      q.pop();
      compactionFiles.push_back(top.first);
    }
  }

  // prepare minKey, maxKey, maxTimeStamp for overlap detection
  uint64_t minKey = UINT64_MAX, maxKey = 0, maxTimeStamp = 0;
  for (const auto &file : compactionFiles) {
    const auto &header = cache.at(file)->getHeader();
    maxKey = max(header.maxKey, maxKey);
    minKey = min(header.minKey, minKey);
    maxTimeStamp = max(header.timeStamp, maxTimeStamp);
  }

  // get SSTables in next level whose keys intersects with compaction Files
  string nextDir = storagePath + "/level-" + to_string(level + 1);
  if (!utils::dirExists(nextDir)) utils::mkdir(nextDir.c_str());
  dirFiles.clear();
  utils::scanDir(nextDir, dirFiles);
  for (string &name : dirFiles) name.insert(0, nextDir + '/');
  for (const auto &file : dirFiles) {
    const auto &header = cache.at(file)->getHeader();
    if ((minKey <= header.minKey && header.minKey <= maxKey) ||
        (minKey <= header.maxKey && header.maxKey <= maxKey)) {
      compactionFiles.push_back(file);
      maxTimeStamp = max(maxTimeStamp, header.timeStamp);
    }
  }

  const auto k = compactionFiles.size();
  unsigned long pairNum = 0;

  // check if it is the last level
  bool lastLevel = false;
  if (!utils::dirExists(storagePath + "/level-" + to_string(level + 2)))
    lastLevel = true;

  // read dictionaries from dics
  vector<SSTableDic> dics(compactionFiles.size());
  for (uint64_t i = 0; i < k; i++) {
    // read dic
    SSTable::readDic(compactionFiles[i], dics[i]);
    utils::rmfile(compactionFiles[i].c_str());
    pairNum += dics[i].size();
  }

  // merge the dics, convert to SSTables
  vector<uint64_t> indices(k);
  SSTableDic mergedDic;
  uint64_t lastTimeStamp = 0;
  while (pairNum--) {
    // find the next pair to merge
    minKey = UINT64_MAX;
    auto minDic = 0;
    for (uint64_t i = 0; i < k; i++) {
      if (indices[i] < dics[i].size() &&
          dics[i].at(indices[i]).first < minKey) {
        minKey = dics[i].at(indices[i]).first;
        minDic = i;
      }
    }
    const auto &pair = dics[minDic].at(indices[minDic]++);

    const auto &header = cache.at(compactionFiles[minDic])->getHeader();

    // duplicate keys, select the one with the largest timeStamp
    if (!mergedDic.empty() && pair.first == mergedDic.back().first) {
      if (header.timeStamp < lastTimeStamp)
        continue;
      else
        mergedDic.pop_back();
    }

    mergedDic.emplace_back(pair.first, pair.second);
    lastTimeStamp = header.timeStamp;
  }

  // split to SSTable
  SSTableDic t;  // TODO: can be optimized out
  uint64_t valueSize = 0, length = 0;
  for (const auto &pair : mergedDic) {
    // last level should not contain deleted value
    if (lastLevel && pair.second == "~DELETED~") continue;

    if (overflow(length + 1, valueSize + pair.second.size())) {
      auto fileName = nextDir + "/" + to_string(fileNums++) + ".sst";
      SSTable::toSSTable(t, fileName, maxTimeStamp);
      cache.emplace(fileName, new SSTableCache(t, maxTimeStamp, fileName));
      valueSize = 0;
      length = 0;
      t.clear();
    }

    length++;
    valueSize += pair.second.size();
    t.push_back(pair);
  }

  // delete cache
  for (uint64_t i = 0; i < k; i++) {
    // delete cache
    assert(cache.count(compactionFiles[i]));
    auto c = cache.at(compactionFiles[i]);
    delete c;
    cache.erase(compactionFiles[i]);
  }

  // convert the remaining key value pairs to a SSTable
  if (!t.empty()) {
    auto fileName = nextDir + "/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(t, fileName, maxTimeStamp);
    cache.emplace(fileName, new SSTableCache(t, maxTimeStamp, fileName));
  }

  // compact next level
  compaction(level + 1);
}